

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::
start_aggregate<unsigned_short,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_sv,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_ev>
          (context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>
           *this,array_sv *sv,array_ev *ev,char *load_pos,size_t *off)

{
  pointer *pppoVar1;
  ushort uVar2;
  bool bVar3;
  parse_return pVar4;
  uint size;
  
  uVar2 = *(ushort *)load_pos;
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  if (uVar2 == 0) {
    bVar3 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::array_sv::operator()(sv,0);
    if (!bVar3) goto LAB_0018be47;
    pppoVar1 = &(ev->m_visitor_holder->m_visitor->m_stack).
                super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppoVar1 = *pppoVar1 + -1;
    pVar4 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::consume
                      ((unpack_stack *)(this + 0x20),
                       (parse_helper<msgpack::v2::detail::create_object_visitor> *)this);
  }
  else {
    size = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    bVar3 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::array_sv::operator()(sv,size);
    if (!bVar3) {
LAB_0018be47:
      *off = *(long *)(this + 8) - *(long *)this;
      return PARSE_STOP_VISITOR;
    }
    pVar4 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::push
                      ((unpack_stack *)(this + 0x20),
                       (parse_helper<msgpack::v2::detail::create_object_visitor> *)this,
                       MSGPACK_CT_ARRAY_ITEM,size);
  }
  if (pVar4 == PARSE_CONTINUE) {
    *(undefined4 *)(this + 0x18) = 0;
    pVar4 = PARSE_CONTINUE;
  }
  else {
    *off = *(long *)(this + 8) - *(long *)this;
  }
  return pVar4;
}

Assistant:

parse_return start_aggregate(
        StartVisitor const& sv,
        EndVisitor const& ev,
        const char* load_pos,
        std::size_t& off) {
        typename value<T>::type size;
        load<T>(size, load_pos);
        ++m_current;
        if (size == 0) {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            if (!ev()) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.consume(holder());
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        else {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.push(holder(), sv.type(), static_cast<uint32_t>(size));
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        m_cs = MSGPACK_CS_HEADER;
        return PARSE_CONTINUE;
    }